

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_config.c
# Opt level: O0

int pt_filter_addr_check(pt_conf_addr_filter *filter,uint64_t addr)

{
  int status;
  uint64_t addr_local;
  pt_conf_addr_filter *filter_local;
  
  filter_local._4_4_ = pt_filter_check_cfg_stop(filter,addr);
  if (0 < filter_local._4_4_) {
    filter_local._4_4_ = pt_filter_check_cfg_filter(filter,addr);
  }
  return filter_local._4_4_;
}

Assistant:

int pt_filter_addr_check(const struct pt_conf_addr_filter *filter,
			 uint64_t addr)
{
	int status;

	status = pt_filter_check_cfg_stop(filter, addr);
	if (status <= 0)
		return status;

	return pt_filter_check_cfg_filter(filter, addr);
}